

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::WildcardPattern::matches(WildcardPattern *this,string *str)

{
  logic_error *this_00;
  undefined1 local_b0 [32];
  WildcardPattern local_90;
  undefined1 local_60 [32];
  undefined1 local_40 [40];
  string *str_local;
  WildcardPattern *this_local;
  
  local_40._32_8_ = str;
  str_local = (string *)this;
  switch(this->m_wildcard) {
  case NoWildcard:
    adjustCase((WildcardPattern *)local_40,(string *)this);
    this_local._7_1_ =
         std::operator==(&this->m_pattern,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
    std::__cxx11::string::~string((string *)local_40);
    break;
  case WildcardAtStart:
    adjustCase((WildcardPattern *)local_60,(string *)this);
    this_local._7_1_ = endsWith((string *)local_60,&this->m_pattern);
    std::__cxx11::string::~string((string *)local_60);
    break;
  case WildcardAtEnd:
    adjustCase((WildcardPattern *)(local_b0 + 0x20),(string *)this);
    this_local._7_1_ = startsWith((string *)(local_b0 + 0x20),&this->m_pattern);
    std::__cxx11::string::~string((string *)(local_b0 + 0x20));
    break;
  case WildcardAtBothEnds:
    adjustCase((WildcardPattern *)local_b0,(string *)this);
    this_local._7_1_ = contains((string *)local_b0,&this->m_pattern);
    std::__cxx11::string::~string((string *)local_b0);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unknown enum");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

virtual bool matches( std::string const& str ) const {
            switch( m_wildcard ) {
                case NoWildcard:
                    return m_pattern == adjustCase( str );
                case WildcardAtStart:
                    return endsWith( adjustCase( str ), m_pattern );
                case WildcardAtEnd:
                    return startsWith( adjustCase( str ), m_pattern );
                case WildcardAtBothEnds:
                    return contains( adjustCase( str ), m_pattern );
            }

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wunreachable-code"
#endif
            throw std::logic_error( "Unknown enum" );
#ifdef __clang__
#pragma clang diagnostic pop
#endif
        }